

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomSubset *subset,uint32_t indent,
          bool closing_brace)

{
  ostream *poVar1;
  TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *attr;
  TypedAttribute<tinyusdz::Token> *attr_00;
  tinyusdz *this_00;
  uint32_t uVar2;
  string *psVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  undefined3 in_register_00000081;
  uint32_t indent_00;
  tinyusdz *local_3c8;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  allocator local_339;
  undefined1 local_338 [32];
  string local_318;
  allocator local_2f1;
  string local_2f0;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  GeomSubset *subset_local;
  
  indent_00 = CONCAT31(in_register_00000081,closing_brace);
  local_1c = (uint)subset;
  local_1d = (byte)indent & 1;
  psVar3 = __return_storage_ptr__;
  ptStack_18 = this;
  subset_local = (GeomSubset *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  uVar2 = (uint32_t)psVar3;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar1 = std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(ptStack_18 + 0x9f8),s);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = std::operator<<(poVar1," GeomSubset \"");
  poVar1 = std::operator<<(poVar1,(string *)(ptStack_18 + 0x9d8));
  std::operator<<(poVar1,"\"\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
  poVar1 = std::operator<<(aoStack_198,(string *)&local_208);
  std::operator<<(poVar1,"(\n");
  std::__cxx11::string::~string((string *)&local_208);
  print_prim_metas_abi_cxx11_
            (&local_228,ptStack_18 + 0x1140,(PrimMeta *)(ulong)(local_1c + 1),uVar2);
  std::operator<<(aoStack_198,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
  poVar1 = std::operator<<(aoStack_198,(string *)&local_248);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&local_248);
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,n_02);
  poVar1 = std::operator<<(aoStack_198,(string *)&local_268);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string((string *)&local_268);
  attr = (TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *)(ptStack_18 + 0xa08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"elementType",&local_2a9);
  print_typed_token_attr<tinyusdz::GeomSubset::ElementType>(&local_288,attr,&local_2a8,local_1c + 1)
  ;
  std::operator<<(aoStack_198,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  attr_00 = (TypedAttribute<tinyusdz::Token> *)(ptStack_18 + 0xc40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"familyName",&local_2f1);
  print_typed_attr<tinyusdz::Token>(&local_2d0,attr_00,&local_2f0,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  this_00 = ptStack_18 + 0xe98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_338,"indices",&local_339);
  uVar2 = local_1c + 1;
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_338 + 0x20),this_00,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_338,(string *)(ulong)uVar2,indent_00);
  std::operator<<(aoStack_198,(string *)(local_338 + 0x20));
  std::__cxx11::string::~string((string *)(local_338 + 0x20));
  std::__cxx11::string::~string((string *)local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  print_material_binding_abi_cxx11_
            (&local_360,ptStack_18,(MaterialBinding *)(ulong)(local_1c + 1),uVar2);
  std::operator<<(aoStack_198,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  local_3c8 = (tinyusdz *)0x0;
  if (ptStack_18 != (tinyusdz *)0x0) {
    local_3c8 = ptStack_18 + 0x990;
  }
  print_collection_abi_cxx11_
            (&local_380,local_3c8,(Collection *)(ulong)(local_1c + 1),(uint32_t)ptStack_18);
  std::operator<<(aoStack_198,(string *)&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  print_props(&local_3a0,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(ptStack_18 + 0x1110),local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_3c0,(pprint *)(ulong)local_1c,n_03);
    poVar1 = std::operator<<(aoStack_198,(string *)&local_3c0);
    std::operator<<(poVar1,"}\n");
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomSubset &subset, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(subset.spec) << " GeomSubset \""
     << subset.name << "\"\n";
  ss << pprint::Indent(indent) << "(\n";
  ss << print_prim_metas(subset.meta, indent + 1);
  ss << pprint::Indent(indent) << ")\n";
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_token_attr(subset.elementType, "elementType", indent + 1);
  ss << print_typed_attr(subset.familyName, "familyName", indent + 1);
  ss << print_typed_attr(subset.indices, "indices", indent + 1);

  ss << print_material_binding(&subset, indent + 1);
  ss << print_collection(&subset, indent + 1);

  ss << print_props(subset.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}